

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<DataStream,uint256,std::allocator<uint256>>
               (DataStream *is,vector<uint256,_std::allocator<uint256>_> *v)

{
  long in_FS_OFFSET;
  Wrapper<VectorFormatter<DefaultFormatter>,_std::vector<uint256,_std::allocator<uint256>_>_&>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.m_object = v;
  Wrapper<VectorFormatter<DefaultFormatter>,_std::vector<uint256,_std::allocator<uint256>_>_&>::
  Unserialize<DataStream>(&local_10,is);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}